

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QTextCharFormat * __thiscall
QMap<QDate,_QTextCharFormat>::value
          (QMap<QDate,_QTextCharFormat> *this,QDate *key,QTextCharFormat *defaultValue)

{
  bool bVar1;
  QTextCharFormat *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>
  *in_stack_ffffffffffffffa8;
  QTextCharFormat *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>_>
                      *)0x523736);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>_>
                  *)0x523764);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x523775);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>_>_>
                  *)0x523784);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QDate,_QTextCharFormat,_std::less<QDate>,_std::allocator<std::pair<const_QDate,_QTextCharFormat>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_QDate,_QTextCharFormat>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_QDate,_QTextCharFormat>_> *)0x5237b4);
      QTextCharFormat::QTextCharFormat(this_00,(QTextCharFormat *)in_stack_ffffffffffffffa8);
    }
    else {
      QTextCharFormat::QTextCharFormat(this_00,(QTextCharFormat *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    QTextCharFormat::QTextCharFormat(this_00,(QTextCharFormat *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }